

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

bool __thiscall Edge::GetBindingBool(Edge *this,string *key)

{
  byte bVar1;
  string local_38;
  string *local_18;
  string *key_local;
  Edge *this_local;
  
  local_18 = key;
  key_local = (string *)this;
  GetBinding(&local_38,this,key);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_38);
  return (bool)((bVar1 ^ 0xff) & 1);
}

Assistant:

bool Edge::GetBindingBool(const string& key) const {
  return !GetBinding(key).empty();
}